

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O0

int uv__fs_closedir(uv_fs_t *req)

{
  void *pvVar1;
  uv_dir_t *dir;
  uv_fs_t *req_local;
  
  pvVar1 = req->ptr;
  if (*(long *)((long)pvVar1 + 0x30) != 0) {
    closedir(*(DIR **)((long)pvVar1 + 0x30));
    *(undefined8 *)((long)pvVar1 + 0x30) = 0;
  }
  uv__free(req->ptr);
  req->ptr = (void *)0x0;
  return 0;
}

Assistant:

static int uv__fs_closedir(uv_fs_t* req) {
  uv_dir_t* dir;

  dir = req->ptr;

  if (dir->dir != NULL) {
    closedir(dir->dir);
    dir->dir = NULL;
  }

  uv__free(req->ptr);
  req->ptr = NULL;
  return 0;
}